

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_status_t
lzham::lzham_lib_decompress_memory
          (lzham_decompress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  ulong uVar1;
  lzham_decompress_status_t lVar2;
  uint32 uVar3;
  lzham_decompress_state_ptr p;
  lzham_decompress_params params;
  size_t local_60;
  lzham_decompress_params local_58;
  
  if (pParams == (lzham_decompress_params *)0x0) {
    lVar2 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else {
    local_58.m_struct_size = pParams->m_struct_size;
    local_58.m_dict_size_log2 = pParams->m_dict_size_log2;
    uVar1._0_4_ = pParams->m_table_update_rate;
    uVar1._4_4_ = pParams->m_decompress_flags;
    local_58.m_num_seed_bytes = pParams->m_num_seed_bytes;
    local_58._20_4_ = *(undefined4 *)&pParams->field_0x14;
    local_58.m_pSeed_bytes = pParams->m_pSeed_bytes;
    local_58.m_table_max_update_interval = pParams->m_table_max_update_interval;
    local_58.m_table_update_interval_slow_rate = pParams->m_table_update_interval_slow_rate;
    local_58._8_8_ = uVar1 | 0x100000000;
    local_60 = src_len;
    p = lzham_lib_decompress_init(&local_58);
    if (p == (lzham_decompress_state_ptr)0x0) {
      lVar2 = LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
    }
    else {
      lVar2 = lzham_lib_decompress(p,pSrc_buf,&local_60,pDst_buf,pDst_len,1);
      uVar3 = lzham_lib_decompress_deinit(p);
      if (pAdler32 != (lzham_uint32 *)0x0) {
        *pAdler32 = uVar3;
      }
    }
  }
  return lVar2;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress_memory(const lzham_decompress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if (!pParams)
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;

      lzham_decompress_params params(*pParams);
      params.m_decompress_flags |= LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED;

      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;

      lzham_decompress_status_t status = lzham_lib_decompress(pState, pSrc_buf, &src_len, pDst_buf, pDst_len, true);

      uint32 adler32 = lzham_lib_decompress_deinit(pState);
      if (pAdler32)
         *pAdler32 = adler32;

      return status;
   }